

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int enc_uint64(archive_write *a,uint64_t val)

{
  ssize_t sVar1;
  uint uVar2;
  size_t s;
  byte local_9 [9];
  
  uVar2 = 0x80;
  s = 1;
  local_9[0] = 0;
  do {
    if (val < uVar2) {
      local_9[0] = (byte)val | local_9[0];
      goto LAB_0044a9c5;
    }
    local_9[s] = (byte)val;
    val = val >> 8;
    local_9[0] = local_9[0] | (byte)uVar2;
    uVar2 = uVar2 >> 1;
    s = s + 1;
  } while (s != 9);
  s = 9;
LAB_0044a9c5:
  sVar1 = compress_out(a,local_9,s,ARCHIVE_Z_RUN);
  return (int)sVar1;
}

Assistant:

static int
enc_uint64(struct archive_write *a, uint64_t val)
{
	unsigned mask = 0x80;
	uint8_t numdata[9];
	int i;

	numdata[0] = 0;
	for (i = 1; i < (int)sizeof(numdata); i++) {
		if (val < mask) {
			numdata[0] |= (uint8_t)val;
			break;
		}
		numdata[i] = (uint8_t)val;
		val >>= 8;
		numdata[0] |= mask;
		mask >>= 1;
	}
	return ((int)compress_out(a, numdata, i, ARCHIVE_Z_RUN));
}